

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void __thiscall Catch::Option<Catch::TagAlias>::reset(Option<Catch::TagAlias> *this)

{
  TagAlias *in_RDI;
  
  if (*(long *)in_RDI != 0) {
    TagAlias::~TagAlias(in_RDI);
  }
  *(undefined8 *)in_RDI = 0;
  return;
}

Assistant:

void reset() {
            if( nullableValue )
                nullableValue->~T();
            nullableValue = NULL;
        }